

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O3

int __thiscall xs::PosixTestProcess::readTestLog(PosixTestProcess *this,deUint8 *dst,int numBytes)

{
  deBool dVar1;
  int iVar2;
  deUint64 dVar3;
  
  if ((this->m_logReader).m_isRunning != false) {
LAB_0011363c:
    iVar2 = de::BlockBuffer<unsigned_char>::tryRead(&(this->m_logReader).m_buf,numBytes,dst);
    return iVar2;
  }
  dVar3 = deGetMicroseconds();
  if (dVar3 - this->m_processStartTime < 0x4c4b41) {
    dVar1 = deFileExists((this->m_logFileName)._M_dataplus._M_p);
    if (dVar1 != 0) {
      posix::FileReader::start(&this->m_logReader,(this->m_logFileName)._M_dataplus._M_p);
      goto LAB_0011363c;
    }
  }
  else {
    (*(this->super_TestProcess)._vptr_TestProcess[3])(this);
  }
  return 0;
}

Assistant:

int PosixTestProcess::readTestLog (deUint8* dst, int numBytes)
{
	if (!m_logReader.isRunning())
	{
		if (deGetMicroseconds() - m_processStartTime > LOG_FILE_TIMEOUT*1000)
		{
			// Timeout, kill process.
			terminate();
			return 0; // \todo [2013-08-13 pyry] Throw exception?
		}

		if (!deFileExists(m_logFileName.c_str()))
			return 0;

		// Start reader.
		m_logReader.start(m_logFileName.c_str());
	}

	DE_ASSERT(m_logReader.isRunning());
	return m_logReader.read(dst, numBytes);
}